

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

void __thiscall
Fl_Preferences::Fl_Preferences(Fl_Preferences *this,Fl_Preferences *parent,int groupIndex)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
  this->rootNode = parent->rootNode;
  pNVar2 = parent->node;
  if (-1 < groupIndex) {
    if ((pNVar2->field_0x30 & 4) == 0) {
      iVar1 = 0;
      for (pNVar3 = pNVar2->child_; pNVar3 != (Node *)0x0; pNVar3 = pNVar3->next_) {
        iVar1 = iVar1 + 1;
      }
    }
    else {
      iVar1 = pNVar2->nIndex_;
    }
    if (groupIndex < iVar1) {
      pNVar2 = Node::childNode(pNVar2,groupIndex);
      goto LAB_001c46ac;
    }
  }
  newUUID();
  pNVar2 = Node::addChild(pNVar2,uuidBuffer);
LAB_001c46ac:
  this->node = pNVar2;
  return;
}

Assistant:

Fl_Preferences::Fl_Preferences( Fl_Preferences *parent, int groupIndex ) {
  rootNode = parent->rootNode;
  if (groupIndex<0 || groupIndex>=parent->groups()) {
    node = parent->node->addChild( newUUID() );
  } else {
    node = parent->node->childNode( groupIndex );
  }
}